

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
* jessilib::mbstring_to_ustring<char8_t>
            (pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
             *__return_storage_ptr__,string_view in_mbstring)

{
  bool bVar1;
  const_pointer pvVar2;
  size_type sVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  unsigned_long local_48 [2];
  ulong local_38;
  size_t bytes_read;
  char32_t codepoint;
  mbstate_t mbstate;
  string_view in_mbstring_local;
  pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  *result;
  
  register0x00000030 = in_mbstring._M_len;
  mbstate.__count._3_1_ = 0;
  std::
  pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::
  pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_true>
            (__return_storage_ptr__);
  memset((void *)((long)&bytes_read + 4),0,8);
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&mbstate.__value);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __return_storage_ptr__->first = true;
      return __return_storage_ptr__;
    }
    bytes_read._0_4_ = L'\0';
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&mbstate.__value);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&mbstate.__value);
    uVar4 = mbrtoc32(&bytes_read,pvVar2,sVar3,(long)&bytes_read + 4);
    local_38 = uVar4;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&mbstate.__value);
    if (sVar3 < uVar4) break;
    local_48[0] = 1;
    puVar5 = std::max<unsigned_long>(local_48,&local_38);
    local_38 = *puVar5;
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&mbstate.__value,local_38);
    encode_codepoint<char8_t>(&__return_storage_ptr__->second,(char32_t)bytes_read);
  }
  __return_storage_ptr__->first = false;
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::basic_string<CharT>> mbstring_to_ustring(std::string_view in_mbstring) {
	std::pair<bool, std::basic_string<CharT>> result;

	std::mbstate_t mbstate{};
	while (!in_mbstring.empty()) {
		char32_t codepoint{};
		size_t bytes_read = std::mbrtoc32(&codepoint, in_mbstring.data(), in_mbstring.size(), &mbstate);
		if (bytes_read > in_mbstring.size()) {
			// Some sort of error; return
			result.first = false;
			return result;
		}

		// bytes_read is 0 for null characters; ensure null characters are also removed from the view
		bytes_read = std::max(size_t{1}, bytes_read);
		in_mbstring.remove_prefix(bytes_read);
		encode_codepoint(result.second, codepoint);
	}

	result.first = true;
	return result;
}